

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  Type TVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  uint8_t mutable_;
  Type global_type;
  
  global_type.enum_ = Void;
  mutable_ = '\0';
  RVar3 = ReadType(this,&global_type,"global type");
  TVar1 = global_type;
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    bVar2 = IsConcreteType(this,global_type);
    if (bVar2) {
      RVar3 = ReadU8(this,&mutable_,"global mutability");
      if (RVar3.enum_ != Error) {
        if (mutable_ < 2) {
          out_type->enum_ = (Enum)TVar1;
          *out_mutable = (bool)mutable_;
          EVar4 = Ok;
        }
        else {
          PrintError(this,"global mutability must be 0 or 1");
        }
      }
    }
    else {
      PrintError(this,"invalid global type: %#x",(ulong)(uint)TVar1.enum_);
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}